

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStream_Configure
                  (PaAlsaStream *self,PaStreamParameters *inParams,PaStreamParameters *outParams,
                  double sampleRate,unsigned_long framesPerUserBuffer,double *inputLatency,
                  double *outputLatency,PaUtilHostBufferSizeMode *hostBufferSizeMode)

{
  snd_pcm_uframes_t *psVar1;
  snd_pcm_uframes_t *psVar2;
  snd_pcm_t *psVar3;
  undefined8 uVar4;
  bool bVar5;
  double *latency;
  snd_pcm_uframes_t self_00;
  int iVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  pthread_t pVar11;
  char *errorText;
  snd_pcm_hw_params_t *hwParams;
  PaStreamParameters *pPVar12;
  uint uVar13;
  PaStreamParameters *pPVar14;
  unsigned_long frames;
  char *pcVar15;
  PaAlsaStreamComponent *pPVar16;
  snd_pcm_uframes_t sVar17;
  ulong uVar18;
  PaStreamParameters *params;
  PaAlsaStreamComponent *self_01;
  ulong uVar19;
  double dVar20;
  PaStreamParameters *pPVar21;
  undefined4 uVar22;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  void *pvStack_e0;
  PaStreamParameters *local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  snd_pcm_uframes_t minPlayback;
  snd_pcm_uframes_t maxCapture;
  snd_pcm_uframes_t maxPlayback;
  snd_pcm_uframes_t maxBufferSizeCapture;
  snd_pcm_uframes_t maxBufferSizePlayback;
  double *local_98;
  double local_90;
  PaAlsaStreamComponent *local_88;
  uint local_80;
  undefined4 uStack_7c;
  snd_pcm_uframes_t minCapture;
  PaStreamParameters *local_70;
  PaStreamParameters *local_68;
  ulong local_60;
  PaStreamParameters *local_58;
  double realSr;
  PaStreamParameters *pPStack_48;
  int accurate;
  PaStreamParameters *local_40;
  undefined4 local_34;
  int dir;
  undefined1 auVar23 [16];
  
  pvStack_e0 = (void *)0x10ef0b;
  maxBufferSizePlayback = (snd_pcm_uframes_t)inputLatency;
  local_98 = outputLatency;
  local_70 = inParams;
  local_58 = (PaStreamParameters *)sampleRate;
  sVar8 = snd_pcm_hw_params_sizeof();
  lVar10 = -(sVar8 + 0xf & 0xfffffffffffffff0);
  pPVar21 = (PaStreamParameters *)((long)&local_d8 + lVar10);
  *(undefined8 *)((long)&pvStack_e0 + lVar10) = 0x10ef29;
  memset(pPVar21,0,sVar8);
  *(undefined8 *)((long)&pvStack_e0 + lVar10) = 0x10ef2e;
  sVar8 = snd_pcm_hw_params_sizeof();
  hwParams = (snd_pcm_hw_params_t *)(sVar8 + 0xf & 0xfffffffffffffff0);
  params = (PaStreamParameters *)((long)pPVar21 - (long)hwParams);
  params[-1].hostApiSpecificStreamInfo = (void *)0x10ef4c;
  memset(params,0,sVar8);
  pPVar16 = &self->capture;
  minCapture = (snd_pcm_uframes_t)pPVar16;
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    params[-1].hostApiSpecificStreamInfo = (void *)0x10ef6d;
    paUtilErr_ = PaAlsaStreamComponent_InitialConfigure
                           (pPVar16,pPVar21,(int)&local_58,hwParams,inputLatency);
    if (paUtilErr_ < 0) {
      pcVar15 = 
      "Expression \'PaAlsaStreamComponent_InitialConfigure( &self->capture, inParams, self->primeBuffers, hwParamsCapture, &realSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2714\n"
      ;
      goto LAB_0010f935;
    }
  }
  pPVar16 = &self->playback;
  local_40 = pPVar21;
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    params[-1].hostApiSpecificStreamInfo = (void *)0x10ef9f;
    paUtilErr_ = PaAlsaStreamComponent_InitialConfigure
                           (pPVar16,params,(int)&local_58,hwParams,inputLatency);
    if (paUtilErr_ < 0) {
      pcVar15 = 
      "Expression \'PaAlsaStreamComponent_InitialConfigure( &self->playback, outParams, self->primeBuffers, hwParamsPlayback, &realSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2717\n"
      ;
      goto LAB_0010f935;
    }
  }
  pPVar14 = local_40;
  pPVar12 = local_58;
  pPVar21 = local_70;
  sVar17 = minCapture;
  local_34 = 0;
  realSr._4_4_ = 1;
  psVar3 = (self->playback).pcm;
  local_88 = pPVar16;
  if ((self->capture).pcm == (snd_pcm_t *)0x0) {
    if (psVar3 == (snd_pcm_t *)0x0) {
      params[-1].hostApiSpecificStreamInfo = PaAlsaStream_Terminate;
      __assert_fail("self->playback.pcm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0xa73,
                    "PaError PaAlsaStream_DetermineFramesPerBuffer(PaAlsaStream *, double, const PaStreamParameters *, const PaStreamParameters *, unsigned long, snd_pcm_hw_params_t *, snd_pcm_hw_params_t *, PaUtilHostBufferSizeMode *)"
                   );
    }
    params[-1].hostApiSpecificStreamInfo = (void *)0x10f0db;
    paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                           (pPVar16,outParams,framesPerUserBuffer,(double)pPVar12,
                            (snd_pcm_hw_params_t *)params,(int *)((long)&realSr + 4));
    if (paUtilErr_ < 0) {
      params[-1].hostApiSpecificStreamInfo = (void *)0x10f6be;
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( &self->playback, outputParameters, framesPerUserBuffer, sampleRate, hwParamsPlayback, &accurate )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2677\n"
                       );
      pPVar14 = local_40;
      goto LAB_0010f771;
    }
    uVar18 = (self->playback).framesPerPeriod;
LAB_0010f4d7:
    if (uVar18 == 0) {
      params[-1].hostApiSpecificStreamInfo = (void *)0x10f682;
      PaUtil_DebugPrint(
                       "Expression \'framesPerHostBuffer != 0\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2682\n"
                       );
      paUtilErr_ = -0x2702;
      goto LAB_0010f92e;
    }
    self->maxFramesPerHostBuffer = uVar18;
    if (((self->playback).canMmap == 0 || realSr._4_4_ == 0) &&
       (*hostBufferSizeMode = paUtilBoundedHostBufferSize, realSr._4_4_ == 0)) {
      self->maxFramesPerHostBuffer = uVar18 + 1;
    }
    paUtilErr_ = 0;
    pPVar14 = local_40;
  }
  else {
    if (psVar3 == (snd_pcm_t *)0x0) {
      params[-1].hostApiSpecificStreamInfo = (void *)0x10f110;
      paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                             ((PaAlsaStreamComponent *)sVar17,pPVar21,framesPerUserBuffer,
                              (double)pPVar12,(snd_pcm_hw_params_t *)pPVar14,
                              (int *)((long)&realSr + 4));
      if (-1 < paUtilErr_) {
        uVar18 = (self->capture).framesPerPeriod;
        goto LAB_0010f4d7;
      }
      params[-1].hostApiSpecificStreamInfo = (void *)0x10f792;
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( &self->capture, inputParameters, framesPerUserBuffer, sampleRate, hwParamsCapture, &accurate)\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2670\n"
                       );
    }
    else {
      local_d8 = local_58;
      uStack_d0 = 0;
      local_68 = (PaStreamParameters *)(ulong)(uint)numPeriods_;
      pPStack_48 = outParams;
      if (framesPerUserBuffer == 0) {
        local_34 = 0;
        params[-1].hostApiSpecificStreamInfo = (void *)0x10f141;
        iVar6 = snd_pcm_hw_params_get_period_size_min(pPVar14,&local_80);
        if (iVar6 < 0) {
          params[-1].hostApiSpecificStreamInfo = (void *)0x10f7a2;
          pVar11 = pthread_self();
          params[-1].hostApiSpecificStreamInfo = (void *)0x10f7b4;
          iVar7 = pthread_equal(pVar11,paUnixMainThread);
          if (iVar7 != 0) {
            params[-1].hostApiSpecificStreamInfo = (void *)0x10f7c3;
            pcVar15 = (char *)snd_strerror(iVar6);
            params[-1].hostApiSpecificStreamInfo = (void *)0x8;
            uVar4 = params[-1].hostApiSpecificStreamInfo;
            params[-1].hostApiSpecificStreamInfo = (void *)0x10f7d1;
            PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,pcVar15);
          }
          pcVar15 = 
          "Expression \'alsa_snd_pcm_hw_params_get_period_size_min( hwParamsCapture, &minCapture, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2531\n"
          ;
        }
        else {
          local_34 = 0;
          params[-1].hostApiSpecificStreamInfo = (void *)0x10f15f;
          iVar6 = snd_pcm_hw_params_get_period_size_min(params,&local_c8);
          if (iVar6 < 0) {
            params[-1].hostApiSpecificStreamInfo = (void *)0x10f7e5;
            pVar11 = pthread_self();
            params[-1].hostApiSpecificStreamInfo = (void *)0x10f7f7;
            iVar7 = pthread_equal(pVar11,paUnixMainThread);
            if (iVar7 != 0) {
              params[-1].hostApiSpecificStreamInfo = (void *)0x10f806;
              pcVar15 = (char *)snd_strerror(iVar6);
              params[-1].hostApiSpecificStreamInfo = (void *)0x8;
              uVar4 = params[-1].hostApiSpecificStreamInfo;
              params[-1].hostApiSpecificStreamInfo = (void *)0x10f814;
              PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,pcVar15);
            }
            pcVar15 = 
            "Expression \'alsa_snd_pcm_hw_params_get_period_size_min( hwParamsPlayback, &minPlayback, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2533\n"
            ;
          }
          else {
            local_34 = 0;
            params[-1].hostApiSpecificStreamInfo = (void *)0x10f17d;
            iVar6 = snd_pcm_hw_params_get_period_size_max(pPVar14,&minPlayback);
            if (iVar6 < 0) {
              params[-1].hostApiSpecificStreamInfo = (void *)0x10f828;
              pVar11 = pthread_self();
              params[-1].hostApiSpecificStreamInfo = (void *)0x10f83a;
              iVar7 = pthread_equal(pVar11,paUnixMainThread);
              if (iVar7 != 0) {
                params[-1].hostApiSpecificStreamInfo = (void *)0x10f849;
                pcVar15 = (char *)snd_strerror(iVar6);
                params[-1].hostApiSpecificStreamInfo = (void *)0x8;
                uVar4 = params[-1].hostApiSpecificStreamInfo;
                params[-1].hostApiSpecificStreamInfo = (void *)0x10f857;
                PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,pcVar15);
              }
              pcVar15 = 
              "Expression \'alsa_snd_pcm_hw_params_get_period_size_max( hwParamsCapture, &maxCapture, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2535\n"
              ;
            }
            else {
              local_34 = 0;
              params[-1].hostApiSpecificStreamInfo = (void *)0x10f19b;
              iVar6 = snd_pcm_hw_params_get_period_size_max(params,&maxCapture);
              if (iVar6 < 0) {
                params[-1].hostApiSpecificStreamInfo = (void *)0x10f86b;
                pVar11 = pthread_self();
                params[-1].hostApiSpecificStreamInfo = (void *)0x10f87d;
                iVar7 = pthread_equal(pVar11,paUnixMainThread);
                if (iVar7 != 0) {
                  params[-1].hostApiSpecificStreamInfo = (void *)0x10f88c;
                  pcVar15 = (char *)snd_strerror(iVar6);
                  params[-1].hostApiSpecificStreamInfo = (void *)0x8;
                  uVar4 = params[-1].hostApiSpecificStreamInfo;
                  params[-1].hostApiSpecificStreamInfo = (void *)0x10f89a;
                  PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,pcVar15);
                }
                pcVar15 = 
                "Expression \'alsa_snd_pcm_hw_params_get_period_size_max( hwParamsPlayback, &maxPlayback, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2537\n"
                ;
              }
              else {
                local_60 = CONCAT44(uStack_7c,local_80);
                if (CONCAT44(uStack_7c,local_80) < local_c8) {
                  local_60 = local_c8;
                }
                sVar17 = minPlayback;
                if (maxCapture < minPlayback) {
                  sVar17 = maxCapture;
                }
                if (sVar17 < local_60) {
                  params[-1].hostApiSpecificStreamInfo = (void *)0x10f8b1;
                  PaUtil_DebugPrint(
                                   "Expression \'minPeriodSize <= maxPeriodSize\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2540\n"
                                   );
                  paUtilErr_ = -0x2709;
                  goto LAB_0010f92e;
                }
                local_90 = pPStack_48->suggestedLatency;
                if (local_70->suggestedLatency <= pPStack_48->suggestedLatency) {
                  local_90 = local_70->suggestedLatency;
                }
                params[-1].hostApiSpecificStreamInfo = (void *)0x10f200;
                iVar6 = snd_pcm_hw_params_get_buffer_size_max(pPVar14,&maxPlayback);
                if (iVar6 < 0) {
                  params[-1].hostApiSpecificStreamInfo = (void *)0x10f8c0;
                  pVar11 = pthread_self();
                  params[-1].hostApiSpecificStreamInfo = (void *)0x10f8d2;
                  iVar7 = pthread_equal(pVar11,paUnixMainThread);
                  pcVar15 = 
                  "Expression \'alsa_snd_pcm_hw_params_get_buffer_size_max( hwParamsCapture, &maxBufferSizeCapture )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2548\n"
                  ;
                }
                else {
                  params[-1].hostApiSpecificStreamInfo = (void *)0x10f217;
                  iVar6 = snd_pcm_hw_params_get_buffer_size_max(params,&maxBufferSizeCapture);
                  uVar18 = local_60;
                  if (-1 < iVar6) {
                    uVar9 = (ulong)((double)local_d8 * local_90);
                    uVar9 = (long)((double)local_d8 * local_90 - 9.223372036854776e+18) &
                            (long)uVar9 >> 0x3f | uVar9;
                    if (maxPlayback < maxBufferSizeCapture) {
                      maxBufferSizeCapture = maxPlayback;
                    }
                    uVar19 = maxBufferSizeCapture;
                    if (uVar9 <= maxBufferSizeCapture) {
                      uVar19 = uVar9;
                    }
                    auVar23._8_4_ = (int)(local_60 >> 0x20);
                    auVar23._0_8_ = local_60;
                    auVar23._12_4_ = 0x45300000;
                    uVar22 = (undefined4)local_60;
                    params[-1].hostApiSpecificStreamInfo = (void *)0x10f294;
                    iVar6 = ilogb((auVar23._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0));
                    lVar10 = ((long)iVar6 + 1) - (ulong)((uVar18 - 1 & uVar18) == 0);
                    auVar24._8_4_ = (int)((ulong)lVar10 >> 0x20);
                    auVar24._0_8_ = lVar10;
                    auVar24._12_4_ = 0x45300000;
                    params[-1].hostApiSpecificStreamInfo = (void *)0x10f2cb;
                    dVar20 = exp2((auVar24._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
                    for (uVar18 = (long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f |
                                  (long)dVar20; uVar18 <= sVar17; uVar18 = uVar18 * 2) {
                      psVar3 = (self->playback).pcm;
                      params[-1].hostApiSpecificStreamInfo = (void *)0x10f303;
                      iVar6 = snd_pcm_hw_params_test_period_size(psVar3,params,uVar18,0);
                      pPVar21 = local_40;
                      if (-1 < iVar6) {
                        psVar3 = (self->capture).pcm;
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10f31c;
                        iVar6 = snd_pcm_hw_params_test_period_size(psVar3,pPVar21,uVar18,0);
                        if (-1 < iVar6) break;
                      }
                    }
                    if (local_60 < uVar19 / (ulong)local_68) {
                      local_60 = uVar19 / (ulong)local_68;
                    }
                    uVar9 = local_60;
                    if (sVar17 <= local_60) {
                      uVar9 = sVar17;
                    }
                    auVar25._8_4_ = (int)(uVar9 >> 0x20);
                    auVar25._0_8_ = uVar9;
                    auVar25._12_4_ = 0x45300000;
                    params[-1].hostApiSpecificStreamInfo = (void *)0x10f36e;
                    iVar6 = ilogb((auVar25._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
                    lVar10 = ((long)iVar6 + 1) - (ulong)((uVar9 - 1 & uVar9) == 0);
                    auVar26._8_4_ = (int)((ulong)lVar10 >> 0x20);
                    auVar26._0_8_ = lVar10;
                    auVar26._12_4_ = 0x45300000;
                    local_60 = uVar9;
                    params[-1].hostApiSpecificStreamInfo = (void *)0x10f3a9;
                    dVar20 = exp2((auVar26._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0));
                    for (uVar9 = (long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f |
                                 (long)dVar20; pPVar21 = local_40, uVar18 <= uVar9;
                        uVar9 = uVar9 >> 1) {
                      psVar3 = (self->capture).pcm;
                      params[-1].hostApiSpecificStreamInfo = (void *)0x10f3e2;
                      iVar6 = snd_pcm_hw_params_test_period_size(psVar3,pPVar21,uVar9,0);
                      if (-1 < iVar6) {
                        psVar3 = (self->playback).pcm;
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10f3fa;
                        iVar6 = snd_pcm_hw_params_test_period_size(psVar3,params,uVar9,0);
                        if (-1 < iVar6) break;
                      }
                    }
                    pPVar21 = local_40;
                    uVar19 = local_60;
                    if (uVar18 < uVar9) {
                      uVar18 = uVar9;
                    }
                    if (sVar17 < uVar18) {
                      psVar1 = &(self->capture).framesPerPeriod;
                      (self->capture).framesPerPeriod = local_60;
                      local_34 = 0;
                      psVar3 = (self->capture).pcm;
                      params[-1].hostApiSpecificStreamInfo = (void *)0x10f43b;
                      iVar6 = snd_pcm_hw_params_set_period_size_near(psVar3,pPVar21,psVar1);
                      if (iVar6 < 0) {
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10f94f;
                        pVar11 = pthread_self();
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10f961;
                        iVar7 = pthread_equal(pVar11,paUnixMainThread);
                        if (iVar7 != 0) {
                          params[-1].hostApiSpecificStreamInfo = (void *)0x10f970;
                          pcVar15 = (char *)snd_strerror(iVar6);
                          params[-1].hostApiSpecificStreamInfo = (void *)0x8;
                          uVar4 = params[-1].hostApiSpecificStreamInfo;
                          params[-1].hostApiSpecificStreamInfo = (void *)0x10f97e;
                          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,pcVar15);
                        }
                        pcVar15 = 
                        "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( self->capture.pcm, hwParamsCapture, &self->capture.framesPerPeriod, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2615\n"
                        ;
                      }
                      else {
                        psVar2 = &(self->playback).framesPerPeriod;
                        (self->playback).framesPerPeriod = uVar19;
                        local_34 = 0;
                        psVar3 = (self->playback).pcm;
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10f46a;
                        iVar6 = snd_pcm_hw_params_set_period_size_near(psVar3,params,psVar2);
                        if (-1 < iVar6) {
                          uVar9 = *psVar1;
                          uVar18 = *psVar2;
                          if (uVar18 < uVar9) {
                            uVar18 = uVar9;
                          }
                          goto LAB_0010f480;
                        }
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10f9d2;
                        pVar11 = pthread_self();
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10f9e4;
                        iVar7 = pthread_equal(pVar11,paUnixMainThread);
                        if (iVar7 != 0) {
                          params[-1].hostApiSpecificStreamInfo = (void *)0x10f9f3;
                          pcVar15 = (char *)snd_strerror(iVar6);
                          params[-1].hostApiSpecificStreamInfo = (void *)0x8;
                          uVar4 = params[-1].hostApiSpecificStreamInfo;
                          params[-1].hostApiSpecificStreamInfo = (void *)0x10fa01;
                          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,pcVar15);
                        }
                        pcVar15 = 
                        "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( self->playback.pcm, hwParamsPlayback, &self->playback.framesPerPeriod, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2619\n"
                        ;
                      }
                    }
                    else {
                      psVar3 = (self->capture).pcm;
                      params[-1].hostApiSpecificStreamInfo = (void *)0x10f4a1;
                      iVar6 = snd_pcm_hw_params_set_period_size(psVar3,pPVar21,uVar18,0);
                      if (iVar6 < 0) {
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10f98f;
                        pVar11 = pthread_self();
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10f9a1;
                        iVar7 = pthread_equal(pVar11,paUnixMainThread);
                        if (iVar7 != 0) {
                          params[-1].hostApiSpecificStreamInfo = (void *)0x10f9b0;
                          pcVar15 = (char *)snd_strerror(iVar6);
                          params[-1].hostApiSpecificStreamInfo = (void *)0x8;
                          uVar4 = params[-1].hostApiSpecificStreamInfo;
                          params[-1].hostApiSpecificStreamInfo = (void *)0x10f9be;
                          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,pcVar15);
                        }
                        pcVar15 = 
                        "Expression \'alsa_snd_pcm_hw_params_set_period_size( self->capture.pcm, hwParamsCapture, periodSize, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2600\n"
                        ;
                      }
                      else {
                        psVar3 = (self->playback).pcm;
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10f4bd;
                        iVar6 = snd_pcm_hw_params_set_period_size(psVar3,params,uVar18,0);
                        if (-1 < iVar6) {
                          (self->playback).framesPerPeriod = uVar18;
                          (self->capture).framesPerPeriod = uVar18;
                          outParams = pPStack_48;
                          goto LAB_0010f4d7;
                        }
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10fa15;
                        pVar11 = pthread_self();
                        params[-1].hostApiSpecificStreamInfo = (void *)0x10fa27;
                        iVar7 = pthread_equal(pVar11,paUnixMainThread);
                        if (iVar7 != 0) {
                          params[-1].hostApiSpecificStreamInfo = (void *)0x10fa36;
                          pcVar15 = (char *)snd_strerror(iVar6);
                          params[-1].hostApiSpecificStreamInfo = (void *)0x8;
                          uVar4 = params[-1].hostApiSpecificStreamInfo;
                          params[-1].hostApiSpecificStreamInfo = (void *)0x10fa44;
                          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,pcVar15);
                        }
                        pcVar15 = 
                        "Expression \'alsa_snd_pcm_hw_params_set_period_size( self->playback.pcm, hwParamsPlayback, periodSize, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2602\n"
                        ;
                      }
                    }
                    goto LAB_0010f91c;
                  }
                  params[-1].hostApiSpecificStreamInfo = (void *)0x10f8e3;
                  pVar11 = pthread_self();
                  params[-1].hostApiSpecificStreamInfo = (void *)0x10f8f5;
                  iVar7 = pthread_equal(pVar11,paUnixMainThread);
                  pcVar15 = 
                  "Expression \'alsa_snd_pcm_hw_params_get_buffer_size_max( hwParamsPlayback, &maxBufferSizePlayback )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2549\n"
                  ;
                }
                if (iVar7 != 0) {
                  params[-1].hostApiSpecificStreamInfo = (void *)0x10f90b;
                  errorText = (char *)snd_strerror(iVar6);
                  params[-1].hostApiSpecificStreamInfo = (void *)0x8;
                  uVar4 = params[-1].hostApiSpecificStreamInfo;
                  params[-1].hostApiSpecificStreamInfo = (void *)0x10f919;
                  PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,errorText);
                }
              }
            }
          }
        }
LAB_0010f91c:
        params[-1].hostApiSpecificStreamInfo = (void *)0x10f923;
        PaUtil_DebugPrint(pcVar15);
        paUtilErr_ = -9999;
        goto LAB_0010f92e;
      }
      local_80 = 0;
      local_34 = 0;
      params[-1].hostApiSpecificStreamInfo = (void *)0x10f014;
      iVar6 = snd_pcm_hw_params_get_periods_max(params);
      pPVar21 = local_d8;
      if (iVar6 < 0) {
        params[-1].hostApiSpecificStreamInfo = (void *)0x10f6d1;
        pVar11 = pthread_self();
        params[-1].hostApiSpecificStreamInfo = (void *)0x10f6e3;
        iVar7 = pthread_equal(pVar11,paUnixMainThread);
        if (iVar7 != 0) {
          params[-1].hostApiSpecificStreamInfo = (void *)0x10f6f2;
          pcVar15 = (char *)snd_strerror(iVar6);
          params[-1].hostApiSpecificStreamInfo = (void *)0x8;
          uVar4 = params[-1].hostApiSpecificStreamInfo;
          params[-1].hostApiSpecificStreamInfo = (void *)0x10f700;
          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,pcVar15);
        }
        pcVar15 = 
        "Expression \'alsa_snd_pcm_hw_params_get_periods_max( hwParamsPlayback, &maxPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2636\n"
        ;
      }
      else {
        uVar13 = (uint)local_68;
        pPVar12 = local_40;
        pPVar14 = local_70;
        local_68 = params;
        self_01 = (PaAlsaStreamComponent *)minCapture;
        if (local_80 < uVar13) {
          pPVar12 = params;
          pPVar14 = pPStack_48;
          local_68 = local_40;
          pPVar16 = (PaAlsaStreamComponent *)minCapture;
          self_01 = local_88;
        }
        params[-1].hostApiSpecificStreamInfo = (void *)0x10f064;
        paUtilErr_ = PaAlsaStreamComponent_DetermineFramesPerBuffer
                               (self_01,pPVar14,framesPerUserBuffer,(double)pPVar21,
                                (snd_pcm_hw_params_t *)pPVar12,(int *)((long)&realSr + 4));
        pPVar21 = local_68;
        if (paUtilErr_ < 0) {
          params[-1].hostApiSpecificStreamInfo = (void *)0x10f717;
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStreamComponent_DetermineFramesPerBuffer( first, firstStreamParams, framesPerUserBuffer, sampleRate, firstHwParams, &accurate )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2648\n"
                           );
          pPVar14 = local_40;
          outParams = pPStack_48;
          goto LAB_0010f771;
        }
        pPVar16->framesPerPeriod = self_01->framesPerPeriod;
        local_34 = 0;
        psVar3 = pPVar16->pcm;
        params[-1].hostApiSpecificStreamInfo = (void *)0x10f095;
        iVar6 = snd_pcm_hw_params_set_period_size_near(psVar3,pPVar21,&pPVar16->framesPerPeriod);
        if (-1 < iVar6) {
          uVar18 = (self->capture).framesPerPeriod;
          uVar9 = (self->playback).framesPerPeriod;
          outParams = pPStack_48;
          if (uVar18 != uVar9) {
            if (uVar18 <= uVar9) {
              uVar18 = uVar9;
            }
LAB_0010f480:
            *hostBufferSizeMode = paUtilBoundedHostBufferSize;
            outParams = pPStack_48;
          }
          goto LAB_0010f4d7;
        }
        params[-1].hostApiSpecificStreamInfo = (void *)0x10f727;
        pVar11 = pthread_self();
        params[-1].hostApiSpecificStreamInfo = (void *)0x10f739;
        iVar7 = pthread_equal(pVar11,paUnixMainThread);
        if (iVar7 != 0) {
          params[-1].hostApiSpecificStreamInfo = (void *)0x10f748;
          pcVar15 = (char *)snd_strerror(iVar6);
          params[-1].hostApiSpecificStreamInfo = (void *)0x8;
          uVar4 = params[-1].hostApiSpecificStreamInfo;
          params[-1].hostApiSpecificStreamInfo = (void *)0x10f756;
          PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar4,(long)iVar6,pcVar15);
        }
        pcVar15 = 
        "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( second->pcm, secondHwParams, &second->framesPerPeriod, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2653\n"
        ;
      }
      params[-1].hostApiSpecificStreamInfo = (void *)0x10f764;
      PaUtil_DebugPrint(pcVar15);
      paUtilErr_ = -9999;
      pPVar14 = local_40;
      outParams = pPStack_48;
    }
LAB_0010f771:
    if (paUtilErr_ < 0) {
LAB_0010f92e:
      pcVar15 = 
      "Expression \'PaAlsaStream_DetermineFramesPerBuffer( self, realSr, inParams, outParams, framesPerUserBuffer, hwParamsCapture, hwParamsPlayback, hostBufferSizeMode )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2720\n"
      ;
      goto LAB_0010f935;
    }
  }
  pPVar12 = local_58;
  pPVar21 = local_70;
  self_00 = minCapture;
  sVar17 = maxBufferSizePlayback;
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    if ((self->capture).framesPerPeriod == 0) {
      params[-1].hostApiSpecificStreamInfo = (void *)0x10fa6f;
      __assert_fail("self->capture.framesPerPeriod != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0xaa4,
                    "PaError PaAlsaStream_Configure(PaAlsaStream *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, double *, double *, PaUtilHostBufferSizeMode *)"
                   );
    }
    iVar6 = self->primeBuffers;
    params[-1].hostApiSpecificStreamInfo = (void *)0x10f55a;
    paUtilErr_ = PaAlsaStreamComponent_FinishConfigure
                           ((PaAlsaStreamComponent *)self_00,(snd_pcm_hw_params_t *)pPVar14,pPVar21,
                            iVar6,(double)pPVar12,(PaTime *)sVar17);
    if (paUtilErr_ < 0) {
      pcVar15 = 
      "Expression \'PaAlsaStreamComponent_FinishConfigure( &self->capture, hwParamsCapture, inParams, self->primeBuffers, realSr, inputLatency )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2726\n"
      ;
      goto LAB_0010f935;
    }
  }
  pPVar21 = local_58;
  pPVar16 = local_88;
  latency = local_98;
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    if ((self->playback).framesPerPeriod == 0) {
      params[-1].hostApiSpecificStreamInfo = (void *)0x10fa8e;
      __assert_fail("self->playback.framesPerPeriod != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0xaab,
                    "PaError PaAlsaStream_Configure(PaAlsaStream *, const PaStreamParameters *, const PaStreamParameters *, double, unsigned long, double *, double *, PaUtilHostBufferSizeMode *)"
                   );
    }
    iVar6 = self->primeBuffers;
    local_40 = local_58;
    params[-1].hostApiSpecificStreamInfo = (void *)0x10f5a6;
    paUtilErr_ = PaAlsaStreamComponent_FinishConfigure
                           (pPVar16,(snd_pcm_hw_params_t *)params,outParams,iVar6,(double)pPVar21,
                            latency);
    pPVar21 = local_40;
    if (paUtilErr_ < 0) {
      pcVar15 = 
      "Expression \'PaAlsaStreamComponent_FinishConfigure( &self->playback, hwParamsPlayback, outParams, self->primeBuffers, realSr, outputLatency )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2733\n"
      ;
LAB_0010f935:
      params[-1].hostApiSpecificStreamInfo = (void *)0x10f93c;
      PaUtil_DebugPrint(pcVar15);
      return paUtilErr_;
    }
  }
  (self->streamRepresentation).streamInfo.sampleRate = (double)pPVar21;
  iVar6 = self->callbackMode;
  params[-1].hostApiSpecificStreamInfo = (void *)0xffffffffffffffff;
  sVar17 = (snd_pcm_uframes_t)params[-1].hostApiSpecificStreamInfo;
  if (iVar6 == 0) {
LAB_0010f603:
    if ((self->capture).pcm != (snd_pcm_t *)0x0) goto LAB_0010f60d;
LAB_0010f618:
    bVar5 = true;
  }
  else {
    if ((self->capture).pcm == (snd_pcm_t *)0x0) goto LAB_0010f618;
    if ((self->playback).pcm != (snd_pcm_t *)0x0) {
      params[-1].hostApiSpecificStreamInfo = (void *)0x10f5f5;
      iVar6 = snd_pcm_link();
      if (iVar6 == 0) {
        self->pcmsSynced = 1;
      }
      goto LAB_0010f603;
    }
LAB_0010f60d:
    sVar17 = (self->capture).framesPerPeriod;
    bVar5 = false;
  }
  if ((self->playback).pcm == (snd_pcm_t *)0x0) {
    if (bVar5 || sVar17 == 0xffffffffffffffff) {
      params[-1].hostApiSpecificStreamInfo = (void *)0xffffffffffffffff;
      frames = (unsigned_long)params[-1].hostApiSpecificStreamInfo;
      goto LAB_0010f655;
    }
  }
  else {
    uVar18 = (self->playback).framesPerPeriod;
    params[-1].hostApiSpecificStreamInfo = (void *)0xffffffffffffffff;
    frames = (unsigned_long)params[-1].hostApiSpecificStreamInfo;
    if (uVar18 <= sVar17) {
      frames = uVar18;
    }
    if (uVar18 <= sVar17 || bVar5) goto LAB_0010f655;
  }
  frames = (self->capture).framesPerPeriod;
LAB_0010f655:
  params[-1].hostApiSpecificStreamInfo = (void *)0x10f65d;
  iVar6 = CalculatePollTimeout(self,frames);
  self->pollTimeout = iVar6;
  return 0;
}

Assistant:

static PaError PaAlsaStream_Configure( PaAlsaStream *self, const PaStreamParameters *inParams, const PaStreamParameters*
        outParams, double sampleRate, unsigned long framesPerUserBuffer, double* inputLatency, double* outputLatency,
        PaUtilHostBufferSizeMode* hostBufferSizeMode )
{
    PaError result = paNoError;
    double realSr = sampleRate;
    snd_pcm_hw_params_t* hwParamsCapture, * hwParamsPlayback;

    alsa_snd_pcm_hw_params_alloca( &hwParamsCapture );
    alsa_snd_pcm_hw_params_alloca( &hwParamsPlayback );

    if( self->capture.pcm )
        PA_ENSURE( PaAlsaStreamComponent_InitialConfigure( &self->capture, inParams, self->primeBuffers, hwParamsCapture,
                    &realSr ) );
    if( self->playback.pcm )
        PA_ENSURE( PaAlsaStreamComponent_InitialConfigure( &self->playback, outParams, self->primeBuffers, hwParamsPlayback,
                    &realSr ) );

    PA_ENSURE( PaAlsaStream_DetermineFramesPerBuffer( self, realSr, inParams, outParams, framesPerUserBuffer,
                hwParamsCapture, hwParamsPlayback, hostBufferSizeMode ) );

    if( self->capture.pcm )
    {
        assert( self->capture.framesPerPeriod != 0 );
        PA_ENSURE( PaAlsaStreamComponent_FinishConfigure( &self->capture, hwParamsCapture, inParams, self->primeBuffers, realSr,
                    inputLatency ) );
        PA_DEBUG(( "%s: Capture period size: %lu, latency: %f\n", __FUNCTION__, self->capture.framesPerPeriod, *inputLatency ));
    }
    if( self->playback.pcm )
    {
        assert( self->playback.framesPerPeriod != 0 );
        PA_ENSURE( PaAlsaStreamComponent_FinishConfigure( &self->playback, hwParamsPlayback, outParams, self->primeBuffers, realSr,
                    outputLatency ) );
        PA_DEBUG(( "%s: Playback period size: %lu, latency: %f\n", __FUNCTION__, self->playback.framesPerPeriod, *outputLatency ));
    }

    /* Should be exact now */
    self->streamRepresentation.streamInfo.sampleRate = realSr;

    /* this will cause the two streams to automatically start/stop/prepare in sync.
     * We only need to execute these operations on one of the pair.
     * A: We don't want to do this on a blocking stream.
     */
    if( self->callbackMode && self->capture.pcm && self->playback.pcm )
    {
        int err = alsa_snd_pcm_link( self->capture.pcm, self->playback.pcm );
        if( err == 0 )
            self->pcmsSynced = 1;
        else
            PA_DEBUG(( "%s: Unable to sync pcms: %s\n", __FUNCTION__, alsa_snd_strerror( err ) ));
    }

    {
        unsigned long minFramesPerHostBuffer = PA_MIN( self->capture.pcm ? self->capture.framesPerPeriod : ULONG_MAX,
            self->playback.pcm ? self->playback.framesPerPeriod : ULONG_MAX );
        self->pollTimeout = CalculatePollTimeout( self, minFramesPerHostBuffer );    /* Period in msecs, rounded up */

        /* Time before watchdog unthrottles realtime thread == 1/4 of period time in msecs */
        /* self->threading.throttledSleepTime = (unsigned long) (minFramesPerHostBuffer / sampleRate / 4 * 1000); */
    }

    if( self->callbackMode )
    {
        /* If the user expects a certain number of frames per callback we will either have to rely on block adaption
         * (framesPerHostBuffer is not an integer multiple of framesPerPeriod) or we can simply align the number
         * of host buffer frames with what the user specified */
        if( self->framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* self->alignFrames = 1; */

            /* Unless the ratio between number of host and user buffer frames is an integer we will have to rely
             * on block adaption */
        /*
            if( framesPerHostBuffer % framesPerPeriod != 0 || (self->capture.pcm && self->playback.pcm &&
                        self->capture.framesPerPeriod != self->playback.framesPerPeriod) )
                self->useBlockAdaption = 1;
            else
                self->alignFrames = 1;
        */
        }
    }

error:
    return result;
}